

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayout::insertSpacing(QBoxLayout *this,int index,int size)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  QSpacerItem *pQVar3;
  int w;
  long in_FS_OFFSET;
  QBoxLayoutItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
  bVar1 = RightToLeft < this_00->dir;
  if (bVar1) {
    w = 0;
  }
  else {
    w = size;
    size = 0;
  }
  pQVar3 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,w,size,(uint)bVar1,(uint)!bVar1);
  local_30 = (QBoxLayoutItem *)operator_new(0x10);
  local_30->item = &pQVar3->super_QLayoutItem;
  local_30->stretch = 0;
  local_30->magic = true;
  QtPrivate::QPodArrayOps<QBoxLayoutItem*>::emplace<QBoxLayoutItem*&>
            ((QPodArrayOps<QBoxLayoutItem*> *)&this_00->list,(long)iVar2,&local_30);
  QList<QBoxLayoutItem_*>::begin(&this_00->list);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBoxLayout::insertSpacing(int index, int size)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, size, 0, QSizePolicy::Fixed, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, 0, size, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QBoxLayoutItem *it = new QBoxLayoutItem(b);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}